

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O2

void __thiscall
sfm::ba::BundleAdjustment::update_parameters(BundleAdjustment *this,DenseVectorType *delta_x)

{
  int iVar1;
  vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_> *this_00;
  vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_> *this_01;
  pointer pdVar2;
  BAMode BVar3;
  reference cam;
  reference out;
  reference pt;
  reference out_00;
  ulong uVar4;
  long lVar5;
  BundleAdjustment *this_02;
  size_t i;
  ulong uVar6;
  
  BVar3 = (this->opts).bundle_mode;
  if ((BVar3 & BA_CAMERAS) == 0) {
    lVar5 = 0;
  }
  else {
    uVar6 = 0;
    while( true ) {
      this_00 = this->cameras;
      uVar4 = (long)(this_00->super__Vector_base<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->super__Vector_base<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 7;
      if (uVar4 <= uVar6) break;
      cam = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at(this_00,uVar6);
      iVar1 = this->num_cam_params;
      pdVar2 = (delta_x->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      out = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at(this->cameras,uVar6);
      update_camera(this,cam,pdVar2 + (long)iVar1 * uVar6,out);
      uVar6 = uVar6 + 1;
    }
    lVar5 = uVar4 * (long)this->num_cam_params;
    BVar3 = (this->opts).bundle_mode;
  }
  if ((BVar3 & BA_POINTS) != 0) {
    lVar5 = lVar5 << 3;
    for (uVar6 = 0; this_01 = this->points,
        uVar6 < (ulong)((long)(this_01->
                              super__Vector_base<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_01->
                              super__Vector_base<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
      pt = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at(this_01,uVar6);
      pdVar2 = (delta_x->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_02 = (BundleAdjustment *)this->points;
      out_00 = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at
                         ((vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_> *)this_02,
                          uVar6);
      update_point(this_02,pt,(double *)((long)pdVar2 + lVar5),out_00);
      lVar5 = lVar5 + 0x18;
    }
  }
  return;
}

Assistant:

void
BundleAdjustment::update_parameters (DenseVectorType const& delta_x)
{
    /* Update cameras. */
    std::size_t total_camera_params = 0;
    if (this->opts.bundle_mode & BA_CAMERAS)
    {
        for (std::size_t i = 0; i < this->cameras->size(); ++i)
            this->update_camera(this->cameras->at(i),
                delta_x.data() + this->num_cam_params * i,
                &this->cameras->at(i));
        total_camera_params = this->cameras->size() * this->num_cam_params;
    }

    /* Update points. */
    if (this->opts.bundle_mode & BA_POINTS)
    {
        for (std::size_t i = 0; i < this->points->size(); ++i)
            this->update_point(this->points->at(i),
                delta_x.data() + total_camera_params + i * 3,
                &this->points->at(i));
    }
}